

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void separatetobefnz(lua_State *L,int all)

{
  GCObject *pGVar1;
  GCObject *pGVar2;
  global_State *g;
  GCObject *pGVar3;
  GCObject *pGVar4;
  
  pGVar2 = (GCObject *)&(L->base_ci).extra;
  do {
    pGVar1 = pGVar2;
    pGVar2 = (pGVar1->gch).next;
  } while ((pGVar1->gch).next != (GCObject *)0x0);
  pGVar2 = L->gclist;
  if (pGVar2 != (GCObject *)0x0) {
    pGVar3 = (GCObject *)&L->gclist;
    do {
      pGVar4 = pGVar2;
      if (((pGVar2->gch).marked & 3) != 0 || all != 0) {
        (pGVar2->gch).marked = (pGVar2->gch).marked | 8;
        (pGVar3->gch).next = (pGVar2->gch).next;
        (pGVar2->gch).next = (pGVar1->gch).next;
        (pGVar1->gch).next = pGVar2;
        pGVar1 = pGVar2;
        pGVar4 = pGVar3;
      }
      pGVar2 = (pGVar4->gch).next;
      pGVar3 = pGVar4;
    } while (pGVar2 != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void separatetobefnz (lua_State *L, int all) {
  global_State *g = G(L);
  GCObject **p = &g->finobj;
  GCObject *curr;
  GCObject **lastnext = &g->tobefnz;
  /* find last 'next' field in 'tobefnz' list (to add elements in its end) */
  while (*lastnext != NULL)
    lastnext = &gch(*lastnext)->next;
  while ((curr = *p) != NULL) {  /* traverse all finalizable objects */
    lua_assert(!isfinalized(curr));
    lua_assert(testbit(gch(curr)->marked, SEPARATED));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &gch(curr)->next;  /* don't bother with it */
    else {
      l_setbit(gch(curr)->marked, FINALIZEDBIT); /* won't be finalized again */
      *p = gch(curr)->next;  /* remove 'curr' from 'finobj' list */
      gch(curr)->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &gch(curr)->next;
    }
  }
}